

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O3

Pixel * __thiscall olc::Pixel::operator*=(Pixel *this,float i)

{
  undefined4 in_ECX;
  uint uVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar7 [16];
  undefined1 auVar6 [16];
  
  fVar4 = i * (float)((this->field_0).n & 0xff);
  fVar5 = i * (float)((this->field_0).n >> 8 & 0xff);
  iVar2 = -(uint)(0.0 < fVar4);
  iVar3 = -(uint)(0.0 < fVar5);
  auVar7._4_4_ = iVar3;
  auVar7._0_4_ = iVar2;
  auVar7._8_4_ = iVar3;
  auVar7._12_4_ = iVar3;
  auVar6._8_8_ = auVar7._8_8_;
  auVar6._4_4_ = iVar2;
  auVar6._0_4_ = iVar2;
  uVar1 = movmskpd(in_ECX,auVar6);
  if ((uVar1 & 1) == 0) {
    fVar4 = 0.0;
  }
  if (255.0 <= fVar4) {
    fVar4 = 255.0;
  }
  (this->field_0).field_1.r = (uint8_t)(int)fVar4;
  if ((uVar1 & 2) == 0) {
    fVar5 = 0.0;
  }
  if (255.0 <= fVar5) {
    fVar5 = 255.0;
  }
  (this->field_0).field_1.g = (uint8_t)(int)fVar5;
  fVar4 = (float)(this->field_0).field_1.b * i;
  if (fVar4 <= 0.0) {
    fVar4 = 0.0;
  }
  if (255.0 <= fVar4) {
    fVar4 = 255.0;
  }
  (this->field_0).field_1.b = (uint8_t)(int)fVar4;
  return this;
}

Assistant:

Pixel &Pixel::operator*=(const float i)
	{
		this->r = uint8_t(std::min(255.0f, std::max(0.0f, float(r) * i)));
		this->g = uint8_t(std::min(255.0f, std::max(0.0f, float(g) * i)));
		this->b = uint8_t(std::min(255.0f, std::max(0.0f, float(b) * i)));
		return *this;
	}